

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_rdiv>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __m128 afVar6;
  __m128 _outp_9;
  __m128 _p_9;
  __m256 _outp_8;
  __m256 _p_8;
  int i_4;
  __m256 _b_256_4;
  __m128 _b_128_4;
  float _b_4;
  int y_2;
  float *ptr1_2;
  int z_1;
  int size_4;
  float *outptr_4;
  float *ptr_4;
  int q_3;
  __m128 _outp_7;
  __m128 _p_7;
  __m256 _outp_6;
  __m256 _p_6;
  int i_3;
  __m256 _b_256_3;
  __m128 _b_128_3;
  float _b_3;
  int z;
  int size_3;
  float *outptr_3;
  float *ptr1_1;
  float *ptr_3;
  int q_2;
  __m128 _outp_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _p_4;
  int i_2;
  __m256 _b_256_2;
  __m128 _b_128_2;
  float _b_2;
  int y_1;
  int size_2;
  float *outptr_2;
  float *ptr1;
  float *ptr_2;
  int q_1;
  __m128 _outp_3;
  __m128 _p_3;
  __m256 _outp_2;
  __m256 _p_2;
  int i_1;
  int size_1;
  __m256 _b_256_1;
  __m128 _b_128_1;
  float _b_1;
  float *outptr_1;
  float *ptr_1;
  int q;
  __m128 _outp_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p;
  int i;
  int size;
  __m256 _b_256;
  __m128 _b_128;
  float _b;
  float *outptr;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_rdiv op;
  Mat *m_8;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  undefined1 local_13a0 [32];
  undefined8 uStack_1388;
  float local_1370 [2];
  float afStack_1368 [34];
  undefined1 local_12e0 [32];
  float local_12c0 [2];
  float afStack_12b8 [22];
  undefined1 local_1260 [32];
  float local_1240 [2];
  float afStack_1238 [22];
  undefined1 local_11e0 [32];
  float local_11c0 [2];
  float afStack_11b8 [22];
  undefined1 local_1160 [32];
  float local_1130 [2];
  float afStack_1128 [6];
  float local_1110 [2];
  float afStack_1108 [2];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  int local_10a4;
  __m256 *local_10a0;
  __m256 *pafStack_1098;
  binary_op_rdiv *pbStack_1090;
  undefined8 uStack_1088;
  float local_1080 [2];
  float afStack_1078 [4];
  float local_1068;
  int local_1064;
  undefined8 local_1060;
  undefined8 local_1058;
  undefined8 local_1050;
  undefined4 local_1048;
  long local_1040;
  undefined4 local_1038;
  undefined4 local_1034;
  undefined4 local_1030;
  undefined4 local_102c;
  undefined4 local_1028;
  undefined8 local_1020;
  long local_1018;
  int local_1010;
  int local_100c;
  undefined8 local_1008;
  undefined8 local_1000;
  undefined8 local_ff8;
  undefined4 local_ff0;
  long local_fe8;
  undefined4 local_fe0;
  undefined4 local_fdc;
  undefined4 local_fd8;
  undefined4 local_fd4;
  undefined4 local_fd0;
  undefined8 local_fc8;
  float *local_fc0;
  undefined8 local_fb8;
  undefined8 local_fb0;
  undefined8 local_fa8;
  undefined4 local_fa0;
  long local_f98;
  undefined4 local_f90;
  undefined4 local_f8c;
  undefined4 local_f88;
  undefined4 local_f84;
  undefined4 local_f80;
  undefined8 local_f78;
  float *local_f70;
  int local_f64;
  undefined8 local_f60;
  float afStack_f58 [2];
  float local_f50 [2];
  float afStack_f48 [2];
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  int local_ee4;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_eb0 [2];
  float afStack_ea8 [3];
  float local_e9c;
  int local_e98;
  int local_e94;
  undefined8 local_e90;
  undefined8 local_e88;
  undefined8 local_e80;
  undefined4 local_e78;
  long local_e70;
  undefined4 local_e68;
  undefined4 local_e64;
  undefined4 local_e60;
  undefined4 local_e5c;
  undefined4 local_e58;
  undefined8 local_e50;
  float *local_e48;
  long local_e40;
  undefined8 local_e38;
  undefined8 local_e30;
  undefined8 local_e28;
  undefined4 local_e20;
  long local_e18;
  undefined4 local_e10;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined4 local_e00;
  undefined8 local_df8;
  float *local_df0;
  int local_de4;
  undefined8 local_de0;
  float afStack_dd8 [2];
  float local_dd0 [2];
  float afStack_dc8 [2];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  int local_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  float local_d30 [2];
  float afStack_d28 [3];
  float local_d1c;
  int local_d18;
  int local_d14;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined8 local_d00;
  undefined4 local_cf8;
  long local_cf0;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  undefined4 local_cdc;
  undefined4 local_cd8;
  undefined8 local_cd0;
  float *local_cc8;
  long local_cc0;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined8 local_ca8;
  undefined4 local_ca0;
  long local_c98;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  undefined4 local_c84;
  undefined4 local_c80;
  undefined8 local_c78;
  float *local_c70;
  int local_c64;
  undefined8 local_c60;
  float afStack_c58 [2];
  float local_c50 [2];
  float afStack_c48 [2];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  int local_be8;
  int local_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  float local_bc0 [2];
  float afStack_bb8 [3];
  float local_bac;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined8 local_b98;
  undefined4 local_b90;
  long local_b88;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined8 local_b68;
  float *local_b60;
  undefined8 local_b58;
  undefined8 local_b50;
  undefined8 local_b48;
  undefined4 local_b40;
  long local_b38;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined8 local_b18;
  float *local_b10;
  int local_b04;
  undefined8 local_b00;
  float afStack_af8 [2];
  float local_af0 [2];
  float afStack_ae8 [2];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  int local_a88;
  int local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60 [2];
  float afStack_a58 [3];
  float local_a4c;
  float *local_a48;
  float *local_a40;
  int local_a34;
  int local_a30;
  int local_a2c;
  int local_a28;
  int local_a24;
  int local_a20;
  binary_op_rdiv local_a19 [9];
  long *local_a10;
  long *local_a08;
  long *local_a00;
  long local_9f8;
  long local_9e8;
  long *local_9e0;
  undefined1 local_9d5;
  int local_9d4;
  undefined8 *local_9c8;
  undefined1 local_9bd;
  int local_9bc;
  undefined8 *local_9b0;
  undefined1 local_9a5;
  int local_9a4;
  undefined8 *local_998;
  undefined1 local_98d;
  int local_98c;
  undefined8 *local_980;
  undefined1 local_975;
  int local_974;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  undefined8 *local_938;
  long *local_930;
  long *local_928;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined1 local_8ad;
  int local_8ac;
  undefined8 *local_8a0;
  undefined1 local_88d;
  int local_88c;
  undefined8 *local_880;
  undefined1 local_86d;
  int local_86c;
  undefined8 *local_860;
  undefined1 local_84d;
  int local_84c;
  undefined8 *local_840;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 *local_818;
  float *local_810;
  undefined1 (*local_808) [32];
  float *local_800;
  undefined1 (*local_7f8) [32];
  float *local_7f0;
  undefined1 (*local_7e8) [32];
  float *local_7e0;
  undefined1 (*local_7d8) [32];
  float *local_7d0;
  undefined1 (*local_7c8) [32];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float *local_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float *local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float *local_698;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_674;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_614;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_5fc;
  long local_5f8;
  undefined4 local_5ec;
  long local_5e8;
  float *local_5e0;
  undefined4 local_5d4;
  int local_5d0;
  int local_5cc;
  undefined8 *local_5c8;
  long local_5c0;
  undefined4 local_5b4;
  long local_5b0;
  float *local_5a8;
  undefined4 local_59c;
  int local_598;
  int local_594;
  undefined8 *local_590;
  long local_588;
  undefined4 local_57c;
  long local_578;
  float *local_570;
  undefined4 local_564;
  int local_560;
  int local_55c;
  undefined8 *local_558;
  long local_550;
  undefined4 local_544;
  long local_540;
  float *local_538;
  undefined4 local_52c;
  int local_528;
  int local_524;
  undefined8 *local_520;
  long local_518;
  undefined4 local_50c;
  long local_508;
  float *local_500;
  undefined4 local_4f4;
  int local_4f0;
  int local_4ec;
  undefined8 *local_4e8;
  long local_4e0;
  undefined4 local_4d4;
  long local_4d0;
  float *local_4c8;
  undefined4 local_4bc;
  int local_4b8;
  int local_4b4;
  undefined8 *local_4b0;
  long local_4a8;
  undefined4 local_49c;
  long local_498;
  float *local_490;
  undefined4 local_484;
  int local_480;
  int local_47c;
  undefined8 *local_478;
  long local_470;
  undefined4 local_464;
  long local_460;
  float *local_458;
  undefined4 local_44c;
  int local_448;
  int local_444;
  undefined8 *local_440;
  long local_438;
  undefined4 local_42c;
  long local_428;
  long local_420;
  undefined4 local_414;
  int local_410;
  int local_40c;
  undefined8 *local_408;
  undefined4 local_3fc;
  long local_3f8;
  undefined4 local_3ec;
  long local_3e8;
  undefined4 local_3dc;
  long local_3d8;
  undefined4 local_3cc;
  long local_3c8;
  undefined4 local_3bc;
  long local_3b8;
  undefined4 local_3ac;
  long local_3a8;
  undefined4 local_39c;
  long local_398;
  undefined4 local_38c;
  long local_388;
  undefined4 local_37c;
  long local_378;
  undefined8 *local_328;
  undefined8 *local_318;
  undefined8 *local_308;
  undefined8 *local_2f8;
  undefined8 *local_2e8;
  undefined8 *local_2d8;
  undefined8 *local_2c8;
  undefined8 *local_2b8;
  undefined8 *local_2a8;
  int local_1bc;
  undefined8 *local_1b8;
  int local_1ac;
  int local_19c;
  int local_18c;
  long *local_188;
  int local_17c;
  long *local_178;
  float *local_170;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float local_120 [2];
  float afStack_118 [2];
  float local_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  float local_f0 [2];
  float afStack_e8 [2];
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  float afStack_c8 [4];
  float *local_b8;
  undefined8 local_b0;
  float afStack_a8 [4];
  float *local_98;
  undefined8 local_90;
  float afStack_88 [4];
  float *local_78;
  undefined8 local_70;
  float afStack_68 [4];
  float *local_58;
  undefined8 local_50;
  float afStack_48 [4];
  float *local_38;
  
  local_a20 = *(int *)((long)in_RDI + 0x2c);
  local_a24 = (int)in_RDI[6];
  local_a28 = *(int *)((long)in_RDI + 0x34);
  local_a2c = (int)in_RDI[7];
  local_a30 = (int)in_RDI[3];
  local_a10 = in_RDX;
  local_a08 = in_RSI;
  local_a00 = in_RDI;
  if (((int)in_RDI[5] == 2) && ((int)in_RSI[5] == 1)) {
    for (local_a34 = 0; local_a34 < local_a24; local_a34 = local_a34 + 1) {
      local_188 = local_a00;
      local_18c = local_a34;
      local_a40 = (float *)(*local_a00 +
                           (long)*(int *)((long)local_a00 + 0x2c) * (long)local_a34 * local_a00[2]);
      local_178 = local_a10;
      local_17c = local_a34;
      local_a48 = (float *)(*local_a10 +
                           (long)*(int *)((long)local_a10 + 0x2c) * (long)local_a34 * local_a10[2]);
      local_9e8 = (long)local_a34;
      local_9e0 = local_a08;
      local_a4c = *(float *)(*local_a08 + local_9e8 * 4);
      if (local_a30 == 4) {
        local_928 = local_a08;
        local_128 = (float *)(*local_a08 + (long)(local_a34 << 2) * 4);
        local_1130 = *(float (*) [2])local_128;
        afStack_1128._0_8_ = *(undefined8 *)(local_128 + 2);
      }
      else {
        local_1130[1] = local_a4c;
        local_1130[0] = local_a4c;
        afStack_1128[1] = local_a4c;
        afStack_1128[0] = local_a4c;
        local_610 = local_a4c;
        fStack_60c = local_a4c;
        fStack_608 = local_a4c;
        fStack_604 = local_a4c;
        local_5fc = local_a4c;
      }
      local_a60[0] = local_1130[0];
      local_a60[1] = local_1130[1];
      afStack_a58[0] = afStack_1128[0];
      afStack_a58[1] = afStack_1128[1];
      if (local_a30 == 8) {
        local_930 = local_a08;
        local_7c8 = (undefined1 (*) [32])(*local_a08 + (long)(local_a34 << 3) * 4);
        local_1160 = *local_7c8;
      }
      else {
        local_e0[0] = local_1130[0];
        local_e0[1] = local_1130[1];
        afStack_d8[0] = afStack_1128[0];
        afStack_d8[1] = afStack_1128[1];
        local_1160._8_4_ = afStack_1128[0];
        local_1160._12_4_ = afStack_1128[1];
        local_1160._0_4_ = local_1130[0];
        local_1160._4_4_ = local_1130[1];
        local_1160._24_4_ = afStack_1128[0];
        local_1160._28_4_ = afStack_1128[1];
        local_1160._16_4_ = local_1130[0];
        local_1160._20_4_ = local_1130[1];
      }
      local_a80 = local_1160._0_8_;
      uStack_a78 = local_1160._8_8_;
      uStack_a70 = local_1160._16_8_;
      uStack_a68 = local_1160._24_8_;
      local_a84 = local_a20 * local_a30;
      for (local_a88 = 0; local_a88 + 7 < local_a84; local_a88 = local_a88 + 8) {
        local_7d0 = local_a40;
        uVar3 = *(undefined8 *)local_a40;
        uVar2 = *(undefined8 *)(local_a40 + 2);
        uVar4 = *(undefined8 *)(local_a40 + 4);
        uVar5 = *(undefined8 *)(local_a40 + 6);
        local_ac0 = uVar3;
        uStack_ab8 = uVar2;
        uStack_ab0 = uVar4;
        uStack_aa8 = uVar5;
        BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack8
                  (local_13a0._16_8_,local_13a0._8_8_,local_13a0._0_8_);
        local_698 = local_a48;
        *(undefined8 *)local_a48 = uVar3;
        *(undefined8 *)(local_a48 + 2) = uVar2;
        *(undefined8 *)(local_a48 + 4) = uVar4;
        *(undefined8 *)(local_a48 + 6) = uVar5;
        local_a40 = local_a40 + 8;
        local_a48 = local_a48 + 8;
        local_ae0 = uVar3;
        uStack_ad8 = uVar2;
        uStack_ad0 = uVar4;
        uStack_ac8 = uVar5;
        local_6c0 = uVar3;
        uStack_6b8 = uVar2;
        uStack_6b0 = uVar4;
        uStack_6a8 = uVar5;
      }
      for (; local_a88 + 3 < local_a84; local_a88 = local_a88 + 4) {
        local_130 = local_a40;
        local_af0 = *(float (*) [2])local_a40;
        uVar3 = *(undefined8 *)(local_a40 + 2);
        afStack_ae8 = (float  [2])uVar3;
        afVar6 = BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack4
                           (local_a19,(__m128 *)local_af0,(__m128 *)local_a60);
        local_b00 = afVar6._0_8_;
        local_38 = local_a48;
        *(undefined8 *)local_a48 = local_b00;
        *(undefined8 *)(local_a48 + 2) = uVar3;
        local_a40 = local_a40 + 4;
        local_a48 = local_a48 + 4;
        afStack_af8 = (float  [2])uVar3;
        local_50 = local_b00;
        afStack_48._0_8_ = uVar3;
      }
      for (; local_a88 < local_a84; local_a88 = local_a88 + 1) {
        fVar1 = BinaryOp_x86_avx_functor::binary_op_rdiv::func(local_a19,local_a40,&local_a4c);
        *local_a48 = fVar1;
        local_a40 = local_a40 + 1;
        local_a48 = local_a48 + 1;
      }
    }
  }
  if ((((int)local_a00[5] == 3) || ((int)local_a00[5] == 4)) && ((int)local_a08[5] == 1)) {
    for (local_b04 = 0; local_b04 < local_a2c; local_b04 = local_b04 + 1) {
      local_968 = &local_b58;
      local_4ec = *(int *)((long)local_a00 + 0x2c);
      local_4f0 = (int)local_a00[6];
      local_4f4 = *(undefined4 *)((long)local_a00 + 0x34);
      local_b10 = (float *)(*local_a00 + local_a00[8] * (long)local_b04 * local_a00[2]);
      local_508 = local_a00[2];
      local_50c = (undefined4)local_a00[3];
      local_518 = local_a00[4];
      local_4e8 = &local_b58;
      local_3b8 = (long)local_4ec * (long)local_4f0 * local_508;
      local_938 = &local_b58;
      local_8f8 = &local_b58;
      local_840 = &local_ba8;
      local_5cc = *(int *)((long)local_a10 + 0x2c);
      local_5d0 = (int)local_a10[6];
      local_5d4 = *(undefined4 *)((long)local_a10 + 0x34);
      local_b60 = (float *)(*local_a10 + local_a10[8] * (long)local_b04 * local_a10[2]);
      local_5e8 = local_a10[2];
      local_5ec = (undefined4)local_a10[3];
      local_5f8 = local_a10[4];
      local_5c8 = &local_ba8;
      local_378 = (long)local_5cc * (long)local_5d0 * local_5e8;
      local_818 = &local_ba8;
      local_8f0 = &local_ba8;
      local_b20 = 0;
      local_b24 = 0;
      local_b28 = 0;
      local_b2c = 0;
      local_b40 = 0;
      local_b48 = 0;
      local_b50 = 0;
      local_b58 = 0;
      local_37c = 0x10;
      local_3bc = 0x10;
      local_84c = local_b04;
      local_84d = 1;
      local_974 = local_b04;
      local_975 = 1;
      local_b18 = 0;
      local_b30 = 0;
      local_ba8 = 0;
      local_b98 = 0;
      local_b90 = 0;
      local_b80 = 0;
      local_b7c = 0;
      local_b78 = 0;
      local_b74 = 0;
      local_b70 = 0;
      local_b68 = 0;
      local_ba0 = 0;
      local_9f8 = (long)local_b04;
      local_bac = *(float *)(*local_a08 + local_9f8 * 4);
      if (local_a30 == 4) {
        local_138 = (float *)(*local_a08 + (long)(local_b04 << 2) * 4);
        local_11c0 = *(float (*) [2])local_138;
        afStack_11b8._0_8_ = *(undefined8 *)(local_138 + 2);
      }
      else {
        local_11c0[1] = local_bac;
        local_11c0[0] = local_bac;
        afStack_11b8[1] = local_bac;
        afStack_11b8[0] = local_bac;
        local_630 = local_bac;
        fStack_62c = local_bac;
        fStack_628 = local_bac;
        fStack_624 = local_bac;
        local_614 = local_bac;
      }
      local_bc0[0] = local_11c0[0];
      local_bc0[1] = local_11c0[1];
      afStack_bb8[0] = afStack_11b8[0];
      afStack_bb8[1] = afStack_11b8[1];
      if (local_a30 == 8) {
        local_7d8 = (undefined1 (*) [32])(*local_a08 + (long)(local_b04 << 3) * 4);
        local_11e0 = *local_7d8;
      }
      else {
        local_f0[0] = local_11c0[0];
        local_f0[1] = local_11c0[1];
        afStack_e8[0] = afStack_11b8[0];
        afStack_e8[1] = afStack_11b8[1];
        local_11e0._8_4_ = afStack_11b8[0];
        local_11e0._12_4_ = afStack_11b8[1];
        local_11e0._0_4_ = local_11c0[0];
        local_11e0._4_4_ = local_11c0[1];
        local_11e0._24_4_ = afStack_11b8[0];
        local_11e0._28_4_ = afStack_11b8[1];
        local_11e0._16_4_ = local_11c0[0];
        local_11e0._20_4_ = local_11c0[1];
      }
      local_be0 = local_11e0._0_8_;
      uStack_bd8 = local_11e0._8_8_;
      uStack_bd0 = local_11e0._16_8_;
      uStack_bc8 = local_11e0._24_8_;
      local_be4 = local_a20 * local_a24 * local_a28 * local_a30;
      local_5e0 = local_b60;
      local_500 = local_b10;
      local_2b8 = local_8f0;
      local_2a8 = local_8f8;
      local_b88 = local_5f8;
      local_b38 = local_518;
      for (local_be8 = 0; local_be8 + 7 < local_be4; local_be8 = local_be8 + 8) {
        local_7e0 = local_b10;
        uVar3 = *(undefined8 *)local_b10;
        uVar2 = *(undefined8 *)(local_b10 + 2);
        uVar4 = *(undefined8 *)(local_b10 + 4);
        uVar5 = *(undefined8 *)(local_b10 + 6);
        local_c20 = uVar3;
        uStack_c18 = uVar2;
        uStack_c10 = uVar4;
        uStack_c08 = uVar5;
        BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack8
                  (local_13a0._16_8_,local_13a0._8_8_,local_13a0._0_8_);
        local_6c8 = local_b60;
        *(undefined8 *)local_b60 = uVar3;
        *(undefined8 *)(local_b60 + 2) = uVar2;
        *(undefined8 *)(local_b60 + 4) = uVar4;
        *(undefined8 *)(local_b60 + 6) = uVar5;
        local_b10 = local_b10 + 8;
        local_b60 = local_b60 + 8;
        local_c40 = uVar3;
        uStack_c38 = uVar2;
        uStack_c30 = uVar4;
        uStack_c28 = uVar5;
        local_700 = uVar3;
        uStack_6f8 = uVar2;
        uStack_6f0 = uVar4;
        uStack_6e8 = uVar5;
      }
      for (; local_be8 + 3 < local_be4; local_be8 = local_be8 + 4) {
        local_140 = local_b10;
        local_c50 = *(float (*) [2])local_b10;
        uVar3 = *(undefined8 *)(local_b10 + 2);
        afStack_c48 = (float  [2])uVar3;
        afVar6 = BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack4
                           (local_a19,(__m128 *)local_c50,(__m128 *)local_bc0);
        local_c60 = afVar6._0_8_;
        local_58 = local_b60;
        *(undefined8 *)local_b60 = local_c60;
        *(undefined8 *)(local_b60 + 2) = uVar3;
        local_b10 = local_b10 + 4;
        local_b60 = local_b60 + 4;
        afStack_c58 = (float  [2])uVar3;
        local_70 = local_c60;
        afStack_68._0_8_ = uVar3;
      }
      for (; local_be8 < local_be4; local_be8 = local_be8 + 1) {
        fVar1 = BinaryOp_x86_avx_functor::binary_op_rdiv::func(local_a19,local_b10,&local_bac);
        *local_b60 = fVar1;
        local_b10 = local_b10 + 1;
        local_b60 = local_b60 + 1;
      }
    }
  }
  if (((int)local_a00[5] == 3) && ((int)local_a08[5] == 2)) {
    for (local_c64 = 0; local_c64 < local_a2c; local_c64 = local_c64 + 1) {
      local_980 = &local_cb8;
      local_4b4 = *(int *)((long)local_a00 + 0x2c);
      local_4b8 = (int)local_a00[6];
      local_4bc = *(undefined4 *)((long)local_a00 + 0x34);
      local_c70 = (float *)(*local_a00 + local_a00[8] * (long)local_c64 * local_a00[2]);
      local_4d0 = local_a00[2];
      local_4d4 = (undefined4)local_a00[3];
      local_4e0 = local_a00[4];
      local_4b0 = &local_cb8;
      local_3c8 = (long)local_4b4 * (long)local_4b8 * local_4d0;
      local_950 = &local_cb8;
      local_8e8 = &local_cb8;
      local_cc0 = *local_a08 +
                  (long)*(int *)((long)local_a08 + 0x2c) * (long)local_c64 * local_a08[2];
      local_860 = &local_d10;
      local_594 = *(int *)((long)local_a10 + 0x2c);
      local_598 = (int)local_a10[6];
      local_59c = *(undefined4 *)((long)local_a10 + 0x34);
      local_cc8 = (float *)(*local_a10 + local_a10[8] * (long)local_c64 * local_a10[2]);
      local_5b0 = local_a10[2];
      local_5b4 = (undefined4)local_a10[3];
      local_5c0 = local_a10[4];
      local_590 = &local_d10;
      local_388 = (long)local_594 * (long)local_598 * local_5b0;
      local_820 = &local_d10;
      local_8e0 = &local_d10;
      local_c80 = 0;
      local_c84 = 0;
      local_c88 = 0;
      local_c8c = 0;
      local_ca0 = 0;
      local_ca8 = 0;
      local_cb0 = 0;
      local_cb8 = 0;
      local_19c = local_c64;
      local_38c = 0x10;
      local_3cc = 0x10;
      local_86c = local_c64;
      local_86d = 1;
      local_98c = local_c64;
      local_98d = 1;
      local_c78 = 0;
      local_c90 = 0;
      local_d10 = 0;
      local_d00 = 0;
      local_cf8 = 0;
      local_ce8 = 0;
      local_ce4 = 0;
      local_ce0 = 0;
      local_cdc = 0;
      local_cd8 = 0;
      local_cd0 = 0;
      local_d08 = 0;
      local_d14 = local_a20 * local_a30;
      local_5a8 = local_cc8;
      local_4c8 = local_c70;
      local_2d8 = local_8e0;
      local_2c8 = local_8e8;
      local_cf0 = local_5c0;
      local_c98 = local_4e0;
      for (local_d18 = 0; local_d18 < local_a24; local_d18 = local_d18 + 1) {
        local_d1c = *(float *)(local_cc0 + (long)local_d18 * 4);
        if (local_a30 == 4) {
          local_148 = (float *)(local_cc0 + (long)(local_d18 << 2) * 4);
          local_1240 = *(float (*) [2])local_148;
          afStack_1238._0_8_ = *(undefined8 *)(local_148 + 2);
        }
        else {
          local_1240[1] = local_d1c;
          local_1240[0] = local_d1c;
          afStack_1238[1] = local_d1c;
          afStack_1238[0] = local_d1c;
          local_650 = local_d1c;
          fStack_64c = local_d1c;
          fStack_648 = local_d1c;
          fStack_644 = local_d1c;
          local_634 = local_d1c;
        }
        local_d30[0] = local_1240[0];
        local_d30[1] = local_1240[1];
        afStack_d28[0] = afStack_1238[0];
        afStack_d28[1] = afStack_1238[1];
        if (local_a30 == 8) {
          local_7e8 = (undefined1 (*) [32])(local_cc0 + (long)(local_d18 << 3) * 4);
          local_1260 = *local_7e8;
        }
        else {
          local_100[0] = local_1240[0];
          local_100[1] = local_1240[1];
          afStack_f8[0] = afStack_1238[0];
          afStack_f8[1] = afStack_1238[1];
          local_1260._8_4_ = afStack_1238[0];
          local_1260._12_4_ = afStack_1238[1];
          local_1260._0_4_ = local_1240[0];
          local_1260._4_4_ = local_1240[1];
          local_1260._24_4_ = afStack_1238[0];
          local_1260._28_4_ = afStack_1238[1];
          local_1260._16_4_ = local_1240[0];
          local_1260._20_4_ = local_1240[1];
        }
        local_d60 = local_1260._0_8_;
        uStack_d58 = local_1260._8_8_;
        uStack_d50 = local_1260._16_8_;
        uStack_d48 = local_1260._24_8_;
        for (local_d64 = 0; local_d64 + 7 < local_d14; local_d64 = local_d64 + 8) {
          local_7f0 = local_c70;
          uVar3 = *(undefined8 *)local_c70;
          uVar2 = *(undefined8 *)(local_c70 + 2);
          uVar4 = *(undefined8 *)(local_c70 + 4);
          uVar5 = *(undefined8 *)(local_c70 + 6);
          local_da0 = uVar3;
          uStack_d98 = uVar2;
          uStack_d90 = uVar4;
          uStack_d88 = uVar5;
          BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack8
                    (local_13a0._16_8_,local_13a0._8_8_,local_13a0._0_8_);
          local_708 = local_cc8;
          *(undefined8 *)local_cc8 = uVar3;
          *(undefined8 *)(local_cc8 + 2) = uVar2;
          *(undefined8 *)(local_cc8 + 4) = uVar4;
          *(undefined8 *)(local_cc8 + 6) = uVar5;
          local_c70 = local_c70 + 8;
          local_cc8 = local_cc8 + 8;
          local_dc0 = uVar3;
          uStack_db8 = uVar2;
          uStack_db0 = uVar4;
          uStack_da8 = uVar5;
          local_740 = uVar3;
          uStack_738 = uVar2;
          uStack_730 = uVar4;
          uStack_728 = uVar5;
        }
        for (; local_d64 + 3 < local_d14; local_d64 = local_d64 + 4) {
          local_150 = local_c70;
          local_dd0 = *(float (*) [2])local_c70;
          uVar3 = *(undefined8 *)(local_c70 + 2);
          afStack_dc8 = (float  [2])uVar3;
          afVar6 = BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack4
                             (local_a19,(__m128 *)local_dd0,(__m128 *)local_d30);
          local_de0 = afVar6._0_8_;
          local_78 = local_cc8;
          *(undefined8 *)local_cc8 = local_de0;
          *(undefined8 *)(local_cc8 + 2) = uVar3;
          local_c70 = local_c70 + 4;
          local_cc8 = local_cc8 + 4;
          afStack_dd8 = (float  [2])uVar3;
          local_90 = local_de0;
          afStack_88._0_8_ = uVar3;
        }
        for (; local_d64 < local_d14; local_d64 = local_d64 + 1) {
          fVar1 = BinaryOp_x86_avx_functor::binary_op_rdiv::func(local_a19,local_c70,&local_d1c);
          *local_cc8 = fVar1;
          local_c70 = local_c70 + 1;
          local_cc8 = local_cc8 + 1;
        }
      }
    }
  }
  if (((int)local_a00[5] == 4) && ((int)local_a08[5] == 2)) {
    for (local_de4 = 0; local_de4 < local_a2c; local_de4 = local_de4 + 1) {
      local_998 = &local_e38;
      local_47c = *(int *)((long)local_a00 + 0x2c);
      local_480 = (int)local_a00[6];
      local_484 = *(undefined4 *)((long)local_a00 + 0x34);
      local_df0 = (float *)(*local_a00 + local_a00[8] * (long)local_de4 * local_a00[2]);
      local_498 = local_a00[2];
      local_49c = (undefined4)local_a00[3];
      local_4a8 = local_a00[4];
      local_478 = &local_e38;
      local_3d8 = (long)local_47c * (long)local_480 * local_498;
      local_958 = &local_e38;
      local_8d8 = &local_e38;
      local_e40 = *local_a08 +
                  (long)*(int *)((long)local_a08 + 0x2c) * (long)local_de4 * local_a08[2];
      local_880 = &local_e90;
      local_55c = *(int *)((long)local_a10 + 0x2c);
      local_560 = (int)local_a10[6];
      local_564 = *(undefined4 *)((long)local_a10 + 0x34);
      local_e48 = (float *)(*local_a10 + local_a10[8] * (long)local_de4 * local_a10[2]);
      local_578 = local_a10[2];
      local_57c = (undefined4)local_a10[3];
      local_588 = local_a10[4];
      local_558 = &local_e90;
      local_398 = (long)local_55c * (long)local_560 * local_578;
      local_828 = &local_e90;
      local_8d0 = &local_e90;
      local_e00 = 0;
      local_e04 = 0;
      local_e08 = 0;
      local_e0c = 0;
      local_e20 = 0;
      local_e28 = 0;
      local_e30 = 0;
      local_e38 = 0;
      local_1ac = local_de4;
      local_39c = 0x10;
      local_3dc = 0x10;
      local_88c = local_de4;
      local_88d = 1;
      local_9a4 = local_de4;
      local_9a5 = 1;
      local_df8 = 0;
      local_e10 = 0;
      local_e90 = 0;
      local_e80 = 0;
      local_e78 = 0;
      local_e68 = 0;
      local_e64 = 0;
      local_e60 = 0;
      local_e5c = 0;
      local_e58 = 0;
      local_e50 = 0;
      local_e88 = 0;
      local_e94 = local_a20 * local_a24 * local_a30;
      local_570 = local_e48;
      local_490 = local_df0;
      local_2f8 = local_8d0;
      local_2e8 = local_8d8;
      local_e70 = local_588;
      local_e18 = local_4a8;
      for (local_e98 = 0; local_e98 < local_a28; local_e98 = local_e98 + 1) {
        local_e9c = *(float *)(local_e40 + (long)local_e98 * 4);
        if (local_a30 == 4) {
          local_158 = (float *)(local_e40 + (long)(local_e98 << 2) * 4);
          local_12c0 = *(float (*) [2])local_158;
          afStack_12b8._0_8_ = *(undefined8 *)(local_158 + 2);
        }
        else {
          local_12c0[1] = local_e9c;
          local_12c0[0] = local_e9c;
          afStack_12b8[1] = local_e9c;
          afStack_12b8[0] = local_e9c;
          local_670 = local_e9c;
          fStack_66c = local_e9c;
          fStack_668 = local_e9c;
          fStack_664 = local_e9c;
          local_654 = local_e9c;
        }
        local_eb0[0] = local_12c0[0];
        local_eb0[1] = local_12c0[1];
        afStack_ea8[0] = afStack_12b8[0];
        afStack_ea8[1] = afStack_12b8[1];
        if (local_a30 == 8) {
          local_7f8 = (undefined1 (*) [32])(local_e40 + (long)(local_e98 << 3) * 4);
          local_12e0 = *local_7f8;
        }
        else {
          local_110[0] = local_12c0[0];
          local_110[1] = local_12c0[1];
          afStack_108[0] = afStack_12b8[0];
          afStack_108[1] = afStack_12b8[1];
          local_12e0._8_4_ = afStack_12b8[0];
          local_12e0._12_4_ = afStack_12b8[1];
          local_12e0._0_4_ = local_12c0[0];
          local_12e0._4_4_ = local_12c0[1];
          local_12e0._24_4_ = afStack_12b8[0];
          local_12e0._28_4_ = afStack_12b8[1];
          local_12e0._16_4_ = local_12c0[0];
          local_12e0._20_4_ = local_12c0[1];
        }
        local_ee0 = local_12e0._0_8_;
        uStack_ed8 = local_12e0._8_8_;
        uStack_ed0 = local_12e0._16_8_;
        uStack_ec8 = local_12e0._24_8_;
        for (local_ee4 = 0; local_ee4 + 7 < local_e94; local_ee4 = local_ee4 + 8) {
          local_800 = local_df0;
          uVar3 = *(undefined8 *)local_df0;
          uVar2 = *(undefined8 *)(local_df0 + 2);
          uVar4 = *(undefined8 *)(local_df0 + 4);
          uVar5 = *(undefined8 *)(local_df0 + 6);
          local_f20 = uVar3;
          uStack_f18 = uVar2;
          uStack_f10 = uVar4;
          uStack_f08 = uVar5;
          BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack8
                    (local_13a0._16_8_,local_13a0._8_8_,local_13a0._0_8_);
          local_748 = local_e48;
          *(undefined8 *)local_e48 = uVar3;
          *(undefined8 *)(local_e48 + 2) = uVar2;
          *(undefined8 *)(local_e48 + 4) = uVar4;
          *(undefined8 *)(local_e48 + 6) = uVar5;
          local_df0 = local_df0 + 8;
          local_e48 = local_e48 + 8;
          local_f40 = uVar3;
          uStack_f38 = uVar2;
          uStack_f30 = uVar4;
          uStack_f28 = uVar5;
          local_780 = uVar3;
          uStack_778 = uVar2;
          uStack_770 = uVar4;
          uStack_768 = uVar5;
        }
        for (; local_ee4 + 3 < local_e94; local_ee4 = local_ee4 + 4) {
          local_160 = local_df0;
          local_f50 = *(float (*) [2])local_df0;
          uVar3 = *(undefined8 *)(local_df0 + 2);
          afStack_f48 = (float  [2])uVar3;
          afVar6 = BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack4
                             (local_a19,(__m128 *)local_f50,(__m128 *)local_eb0);
          local_f60 = afVar6._0_8_;
          local_98 = local_e48;
          *(undefined8 *)local_e48 = local_f60;
          *(undefined8 *)(local_e48 + 2) = uVar3;
          local_df0 = local_df0 + 4;
          local_e48 = local_e48 + 4;
          afStack_f58 = (float  [2])uVar3;
          local_b0 = local_f60;
          afStack_a8._0_8_ = uVar3;
        }
        for (; local_ee4 < local_e94; local_ee4 = local_ee4 + 1) {
          fVar1 = BinaryOp_x86_avx_functor::binary_op_rdiv::func(local_a19,local_df0,&local_e9c);
          *local_e48 = fVar1;
          local_df0 = local_df0 + 1;
          local_e48 = local_e48 + 1;
        }
      }
    }
  }
  if (((int)local_a00[5] == 4) && ((int)local_a08[5] == 3)) {
    for (local_f64 = 0; local_f64 < local_a2c; local_f64 = local_f64 + 1) {
      local_9b0 = &local_fb8;
      local_444 = *(int *)((long)local_a00 + 0x2c);
      local_448 = (int)local_a00[6];
      local_44c = *(undefined4 *)((long)local_a00 + 0x34);
      local_f70 = (float *)(*local_a00 + local_a00[8] * (long)local_f64 * local_a00[2]);
      local_460 = local_a00[2];
      local_464 = (undefined4)local_a00[3];
      local_470 = local_a00[4];
      local_440 = &local_fb8;
      local_3e8 = (long)local_444 * (long)local_448 * local_460;
      local_960 = &local_fb8;
      local_8c8 = &local_fb8;
      local_8a0 = &local_1008;
      local_524 = *(int *)((long)local_a10 + 0x2c);
      local_528 = (int)local_a10[6];
      local_52c = *(undefined4 *)((long)local_a10 + 0x34);
      local_fc0 = (float *)(*local_a10 + local_a10[8] * (long)local_f64 * local_a10[2]);
      local_540 = local_a10[2];
      local_544 = (undefined4)local_a10[3];
      local_550 = local_a10[4];
      local_520 = &local_1008;
      local_3a8 = (long)local_524 * (long)local_528 * local_540;
      local_830 = &local_1008;
      local_8c0 = &local_1008;
      local_f80 = 0;
      local_f84 = 0;
      local_f88 = 0;
      local_f8c = 0;
      local_fa0 = 0;
      local_fa8 = 0;
      local_fb0 = 0;
      local_fb8 = 0;
      local_3ac = 0x10;
      local_3ec = 0x10;
      local_8ac = local_f64;
      local_8ad = 1;
      local_9bc = local_f64;
      local_9bd = 1;
      local_f78 = 0;
      local_f90 = 0;
      local_1008 = 0;
      local_ff8 = 0;
      local_ff0 = 0;
      local_fe0 = 0;
      local_fdc = 0;
      local_fd8 = 0;
      local_fd4 = 0;
      local_fd0 = 0;
      local_fc8 = 0;
      local_1000 = 0;
      local_100c = local_a20 * local_a30;
      local_538 = local_fc0;
      local_458 = local_f70;
      local_318 = local_8c0;
      local_308 = local_8c8;
      local_fe8 = local_550;
      local_f98 = local_470;
      for (local_1010 = 0; local_1010 < local_a28; local_1010 = local_1010 + 1) {
        local_9c8 = &local_1060;
        local_40c = *(int *)((long)local_a08 + 0x2c);
        local_410 = (int)local_a08[6];
        local_414 = *(undefined4 *)((long)local_a08 + 0x34);
        local_420 = *local_a08 + local_a08[8] * (long)local_f64 * local_a08[2];
        local_428 = local_a08[2];
        local_42c = (undefined4)local_a08[3];
        local_438 = local_a08[4];
        local_408 = &local_1060;
        local_3f8 = (long)local_40c * (long)local_410 * local_428;
        local_1b8 = &local_1060;
        local_1018 = local_420 + (long)local_40c * (long)local_1010 * local_428;
        local_8b8 = &local_1060;
        local_1bc = local_1010;
        local_3fc = 0x10;
        local_9d4 = local_f64;
        local_9d5 = 1;
        local_1060 = 0;
        local_1050 = 0;
        local_1048 = 0;
        local_1038 = 0;
        local_1034 = 0;
        local_1030 = 0;
        local_102c = 0;
        local_1028 = 0;
        local_1020 = 0;
        local_1058 = 0;
        local_328 = local_8b8;
        local_1040 = local_438;
        for (local_1064 = 0; local_1064 < local_a24; local_1064 = local_1064 + 1) {
          local_1068 = *(float *)(local_1018 + (long)local_1064 * 4);
          if (local_a30 == 4) {
            local_168 = (float *)(local_1018 + (long)(local_1064 << 2) * 4);
            local_1370 = *(float (*) [2])local_168;
            afStack_1368._0_8_ = *(undefined8 *)(local_168 + 2);
          }
          else {
            local_1370[1] = local_1068;
            local_1370[0] = local_1068;
            afStack_1368[1] = local_1068;
            afStack_1368[0] = local_1068;
            local_690 = local_1068;
            fStack_68c = local_1068;
            fStack_688 = local_1068;
            fStack_684 = local_1068;
            local_674 = local_1068;
          }
          local_1080[0] = local_1370[0];
          local_1080[1] = local_1370[1];
          afStack_1078[0] = afStack_1368[0];
          afStack_1078[1] = afStack_1368[1];
          if (local_a30 == 8) {
            local_808 = (undefined1 (*) [32])(local_1018 + (long)(local_1064 << 3) * 4);
            local_13a0 = *local_808;
          }
          else {
            local_120[0] = local_1370[0];
            local_120[1] = local_1370[1];
            afStack_118[0] = afStack_1368[0];
            afStack_118[1] = afStack_1368[1];
            local_13a0._8_4_ = afStack_1368[0];
            local_13a0._12_4_ = afStack_1368[1];
            local_13a0._0_4_ = local_1370[0];
            local_13a0._4_4_ = local_1370[1];
            local_13a0._24_4_ = afStack_1368[0];
            local_13a0._28_4_ = afStack_1368[1];
            local_13a0._16_4_ = local_1370[0];
            local_13a0._20_4_ = local_1370[1];
          }
          uStack_1088 = uStack_1388;
          local_10a0 = local_13a0._0_8_;
          pafStack_1098 = local_13a0._8_8_;
          pbStack_1090 = local_13a0._16_8_;
          for (local_10a4 = 0; local_10a4 + 7 < local_100c; local_10a4 = local_10a4 + 8) {
            local_810 = local_f70;
            uVar3 = *(undefined8 *)local_f70;
            uVar2 = *(undefined8 *)(local_f70 + 2);
            uVar4 = *(undefined8 *)(local_f70 + 4);
            uVar5 = *(undefined8 *)(local_f70 + 6);
            local_10e0 = uVar3;
            uStack_10d8 = uVar2;
            uStack_10d0 = uVar4;
            uStack_10c8 = uVar5;
            BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack8
                      (local_13a0._16_8_,local_13a0._8_8_,local_13a0._0_8_);
            local_788 = local_fc0;
            *(undefined8 *)local_fc0 = uVar3;
            *(undefined8 *)(local_fc0 + 2) = uVar2;
            *(undefined8 *)(local_fc0 + 4) = uVar4;
            *(undefined8 *)(local_fc0 + 6) = uVar5;
            local_f70 = local_f70 + 8;
            local_fc0 = local_fc0 + 8;
            local_1100 = uVar3;
            uStack_10f8 = uVar2;
            uStack_10f0 = uVar4;
            uStack_10e8 = uVar5;
            local_7c0 = uVar3;
            uStack_7b8 = uVar2;
            uStack_7b0 = uVar4;
            uStack_7a8 = uVar5;
          }
          for (; local_10a4 + 3 < local_100c; local_10a4 = local_10a4 + 4) {
            local_170 = local_f70;
            local_1110 = *(float (*) [2])local_f70;
            uVar3 = *(undefined8 *)(local_f70 + 2);
            afStack_1108 = (float  [2])uVar3;
            afVar6 = BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack4
                               (local_a19,(__m128 *)local_1110,(__m128 *)local_1080);
            local_d0 = afVar6._0_8_;
            local_b8 = local_fc0;
            *(undefined8 *)local_fc0 = local_d0;
            *(undefined8 *)(local_fc0 + 2) = uVar3;
            local_f70 = local_f70 + 4;
            local_fc0 = local_fc0 + 4;
            afStack_c8._0_8_ = uVar3;
          }
          for (; local_10a4 < local_100c; local_10a4 = local_10a4 + 1) {
            fVar1 = BinaryOp_x86_avx_functor::binary_op_rdiv::func(local_a19,local_f70,&local_1068);
            *local_fc0 = fVar1;
            local_f70 = local_f70 + 1;
            local_fc0 = local_fc0 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2 && b.dims == 1)
    {
        // type 8
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            float* outptr = c.row(y);

            const float _b = b[y];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + y * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if ((a.dims == 3 || a.dims == 4) && b.dims == 1)
    {
        // type 9 11
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const float _b = b[q];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + q * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * h * d * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if (a.dims == 3 && b.dims == 2)
    {
        // type 10
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int y = 0; y < h; y++)
            {
                const float _b = ptr1[y];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 2)
    {
        // type 12
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * h * elempack;

            for (int z = 0; z < d; z++)
            {
                const float _b = ptr1[z];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + z * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + z * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + z * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 3)
    {
        // type 13
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int z = 0; z < d; z++)
            {
                const float* ptr1 = b.channel(q).row(z);

                for (int y = 0; y < h; y++)
                {
                    const float _b = ptr1[y];
#if __SSE2__
                    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        __m512 _outp = op.func_pack16(_p, _b_512);
                        _mm512_storeu_ps(outptr, _outp);
                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _outp = op.func_pack8(_p, _b_256);
                        _mm256_storeu_ps(outptr, _outp);
                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        __m128 _outp = op.func_pack4(_p, _b_128);
                        _mm_storeu_ps(outptr, _outp);
                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr = op.func(*ptr, _b);
                        ptr += 1;
                        outptr += 1;
                    }
                }
            }
        }
    }

    return 0;
}